

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

void av1_apply_encoding_flags(AV1_COMP *cpi,aom_enc_frame_flags_t flags)

{
  AV1_PRIMARY *pAVar1;
  byte bVar2;
  byte bVar3;
  int ref;
  uint uVar4;
  uint uVar5;
  int i;
  long lVar6;
  uint uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  uVar7 = (uint)flags;
  (cpi->ext_flags).ref_frame_flags = 0x7f;
  if ((flags & 0x7f0000U) == 0) {
    if ((cpi->ppi->rtc_ref).set_ref_frame_config == 0) goto LAB_001b497e;
    uVar5 = 0x7f;
    lVar6 = 0;
    do {
      uVar4 = 1 << ((byte)lVar6 & 0x1f);
      if ((cpi->ppi->rtc_ref).reference[lVar6] != 0) {
        uVar4 = 0;
      }
      uVar5 = uVar5 ^ uVar4;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
    if (0x7f < (int)uVar5) goto LAB_001b497e;
  }
  else {
    uVar4 = 0x7f - ((uVar7 >> 0x10 & 1) != 0);
    uVar5 = uVar4 & 0x7d;
    if ((uVar7 >> 0x11 & 1) == 0) {
      uVar5 = uVar4;
    }
    uVar4 = uVar5 & 0x7b;
    if ((uVar7 >> 0x12 & 1) == 0) {
      uVar4 = uVar5;
    }
    uVar5 = uVar4 & 0x77;
    if ((uVar7 >> 0x13 & 1) == 0) {
      uVar5 = uVar4;
    }
    uVar4 = 0x70;
    if ((uVar7 >> 0x14 & 1) == 0) {
      uVar4 = (uint)((ulong)flags >> 0x11) & 0x30;
    }
    uVar5 = uVar5 ^ uVar4;
  }
  (cpi->ext_flags).ref_frame_flags = uVar5;
LAB_001b497e:
  if ((flags & 0x3800000U) == 0) {
    pAVar1 = cpi->ppi;
    if ((pAVar1->rtc_ref).set_ref_frame_config == 0) {
      (cpi->ext_flags).refresh_frame.update_pending = false;
    }
    else {
      (cpi->ext_flags).refresh_frame.update_pending = true;
      auVar9._0_4_ = -(uint)((pAVar1->rtc_ref).refresh[(pAVar1->rtc_ref).ref_idx[0]] == 0);
      auVar9._4_4_ = -(uint)((pAVar1->rtc_ref).refresh[(pAVar1->rtc_ref).ref_idx[3]] == 0);
      auVar9._8_4_ = -(uint)((pAVar1->rtc_ref).refresh[(pAVar1->rtc_ref).ref_idx[4]] == 0);
      auVar9._12_4_ = -(uint)((pAVar1->rtc_ref).refresh[(pAVar1->rtc_ref).ref_idx[5]] == 0);
      auVar9 = packssdw(auVar9,auVar9);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar9 = packsswb(auVar10 ^ auVar9,auVar10 ^ auVar9);
      uVar5 = auVar9._0_4_ & (uint)DAT_004d0b20;
      (cpi->ext_flags).refresh_frame.last_frame = (_Bool)(char)uVar5;
      (cpi->ext_flags).refresh_frame.golden_frame = (_Bool)(char)(uVar5 >> 8);
      (cpi->ext_flags).refresh_frame.bwd_ref_frame = (_Bool)(char)(uVar5 >> 0x10);
      (cpi->ext_flags).refresh_frame.alt2_ref_frame = (_Bool)(char)(uVar5 >> 0x18);
      (cpi->ext_flags).refresh_frame.alt_ref_frame =
           (pAVar1->rtc_ref).refresh[(pAVar1->rtc_ref).ref_idx[6]] != 0;
      (pAVar1->rtc_ref).non_reference_frame = 1;
      lVar6 = 0;
      do {
        if ((pAVar1->rtc_ref).refresh[lVar6] == 1) {
          (pAVar1->rtc_ref).non_reference_frame = 0;
          break;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
    }
  }
  else {
    bVar8 = (uVar7 >> 0x17 & 1) == 0;
    bVar3 = bVar8 | 0x76;
    if ((uVar7 >> 0x18 & 1) == 0) {
      bVar3 = bVar8 | 0x7e;
    }
    bVar2 = bVar3 & 0xf;
    if ((uVar7 >> 0x19 & 1) == 0) {
      bVar2 = bVar3;
    }
    (cpi->ext_flags).refresh_frame.last_frame = (_Bool)(bVar2 & 1);
    (cpi->ext_flags).refresh_frame.golden_frame = (_Bool)(bVar2 >> 3 & 1);
    (cpi->ext_flags).refresh_frame.alt_ref_frame = (_Bool)(bVar2 >> 6);
    (cpi->ext_flags).refresh_frame.bwd_ref_frame = (_Bool)(bVar2 >> 4 & 1);
    (cpi->ext_flags).refresh_frame.alt2_ref_frame = (_Bool)(bVar2 >> 5 & 1);
    (cpi->ext_flags).refresh_frame.update_pending = true;
  }
  (cpi->ext_flags).use_ref_frame_mvs =
       (_Bool)((uVar7 >> 0x1b & 1) == 0 & (cpi->oxcf).tool_cfg.enable_ref_frame_mvs);
  (cpi->ext_flags).use_error_resilient =
       (_Bool)((byte)((ulong)flags >> 0x1c) & 1 | (cpi->oxcf).tool_cfg.error_resilient_mode);
  (cpi->ext_flags).use_s_frame =
       (_Bool)((byte)((ulong)flags >> 0x1d) & 1 | (cpi->oxcf).kf_cfg.enable_sframe);
  (cpi->ext_flags).use_primary_ref_none = (_Bool)((byte)((ulong)flags >> 0x1e) & 1);
  if ((uVar7 >> 0x1a & 1) != 0) {
    (cpi->ext_flags).refresh_frame_context = false;
    (cpi->ext_flags).refresh_frame_context_pending = true;
  }
  return;
}

Assistant:

void av1_apply_encoding_flags(AV1_COMP *cpi, aom_enc_frame_flags_t flags) {
  // TODO(yunqingwang): For what references to use, external encoding flags
  // should be consistent with internal reference frame selection. Need to
  // ensure that there is not conflict between the two. In AV1 encoder, the
  // priority rank for 7 reference frames are: LAST, ALTREF, LAST2, LAST3,
  // GOLDEN, BWDREF, ALTREF2.

  ExternalFlags *const ext_flags = &cpi->ext_flags;
  ExtRefreshFrameFlagsInfo *const ext_refresh_frame_flags =
      &ext_flags->refresh_frame;
  ext_flags->ref_frame_flags = AOM_REFFRAME_ALL;
  if (flags &
      (AOM_EFLAG_NO_REF_LAST | AOM_EFLAG_NO_REF_LAST2 | AOM_EFLAG_NO_REF_LAST3 |
       AOM_EFLAG_NO_REF_GF | AOM_EFLAG_NO_REF_ARF | AOM_EFLAG_NO_REF_BWD |
       AOM_EFLAG_NO_REF_ARF2)) {
    int ref = AOM_REFFRAME_ALL;

    if (flags & AOM_EFLAG_NO_REF_LAST) ref ^= AOM_LAST_FLAG;
    if (flags & AOM_EFLAG_NO_REF_LAST2) ref ^= AOM_LAST2_FLAG;
    if (flags & AOM_EFLAG_NO_REF_LAST3) ref ^= AOM_LAST3_FLAG;

    if (flags & AOM_EFLAG_NO_REF_GF) ref ^= AOM_GOLD_FLAG;

    if (flags & AOM_EFLAG_NO_REF_ARF) {
      ref ^= AOM_ALT_FLAG;
      ref ^= AOM_BWD_FLAG;
      ref ^= AOM_ALT2_FLAG;
    } else {
      if (flags & AOM_EFLAG_NO_REF_BWD) ref ^= AOM_BWD_FLAG;
      if (flags & AOM_EFLAG_NO_REF_ARF2) ref ^= AOM_ALT2_FLAG;
    }

    av1_use_as_reference(&ext_flags->ref_frame_flags, ref);
  } else {
    if (cpi->ppi->rtc_ref.set_ref_frame_config) {
      int ref = rtc_set_references_external_ref_frame_config(cpi);
      av1_use_as_reference(&ext_flags->ref_frame_flags, ref);
    }
  }

  if (flags &
      (AOM_EFLAG_NO_UPD_LAST | AOM_EFLAG_NO_UPD_GF | AOM_EFLAG_NO_UPD_ARF)) {
    int upd = AOM_REFFRAME_ALL;

    // Refreshing LAST/LAST2/LAST3 is handled by 1 common flag.
    if (flags & AOM_EFLAG_NO_UPD_LAST) upd ^= AOM_LAST_FLAG;

    if (flags & AOM_EFLAG_NO_UPD_GF) upd ^= AOM_GOLD_FLAG;

    if (flags & AOM_EFLAG_NO_UPD_ARF) {
      upd ^= AOM_ALT_FLAG;
      upd ^= AOM_BWD_FLAG;
      upd ^= AOM_ALT2_FLAG;
    }

    ext_refresh_frame_flags->last_frame = (upd & AOM_LAST_FLAG) != 0;
    ext_refresh_frame_flags->golden_frame = (upd & AOM_GOLD_FLAG) != 0;
    ext_refresh_frame_flags->alt_ref_frame = (upd & AOM_ALT_FLAG) != 0;
    ext_refresh_frame_flags->bwd_ref_frame = (upd & AOM_BWD_FLAG) != 0;
    ext_refresh_frame_flags->alt2_ref_frame = (upd & AOM_ALT2_FLAG) != 0;
    ext_refresh_frame_flags->update_pending = 1;
  } else {
    if (cpi->ppi->rtc_ref.set_ref_frame_config)
      rtc_set_updates_ref_frame_config(ext_refresh_frame_flags,
                                       &cpi->ppi->rtc_ref);
    else
      ext_refresh_frame_flags->update_pending = 0;
  }

  ext_flags->use_ref_frame_mvs = cpi->oxcf.tool_cfg.enable_ref_frame_mvs &
                                 ((flags & AOM_EFLAG_NO_REF_FRAME_MVS) == 0);
  ext_flags->use_error_resilient = cpi->oxcf.tool_cfg.error_resilient_mode |
                                   ((flags & AOM_EFLAG_ERROR_RESILIENT) != 0);
  ext_flags->use_s_frame =
      cpi->oxcf.kf_cfg.enable_sframe | ((flags & AOM_EFLAG_SET_S_FRAME) != 0);
  ext_flags->use_primary_ref_none =
      (flags & AOM_EFLAG_SET_PRIMARY_REF_NONE) != 0;

  if (flags & AOM_EFLAG_NO_UPD_ENTROPY) {
    update_entropy(&ext_flags->refresh_frame_context,
                   &ext_flags->refresh_frame_context_pending, 0);
  }
}